

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

void __thiscall QSizeGrip::QSizeGrip(QSizeGrip *this,QWidget *parent)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x298);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QSizeGripPrivate_007f9578;
  *(undefined8 *)&this_00->field_0x254 = 0;
  *(undefined8 *)&this_00[1].field_0x4 = 0;
  *(undefined8 *)&this_00[1].field_0xc = 0xffffffffffffffff;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  this_00[1].field_0x24 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined8 *)&this_00[1].field_0x30 = 0;
  this_00[1].field_0x38 = 0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f9630;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QSizeGrip_007f97e0;
  QSizeGripPrivate::init
            (*(QSizeGripPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QSizeGrip::QSizeGrip(QWidget * parent)
    : QWidget(*new QSizeGripPrivate, parent, { })
{
    Q_D(QSizeGrip);
    d->init();
}